

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_json.c
# Opt level: O3

uint json_get_anydata(lyd_node_anydata *any,char *data)

{
  char *pcVar1;
  ushort **ppuVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  char cVar6;
  uint len;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint local_34;
  
  local_34 = 0;
  if (*data == '{') {
    uVar4 = 0;
    while( true ) {
      iVar7 = (int)uVar4;
      if ((0x20 < (ulong)(byte)data[uVar4 + 1]) ||
         ((0x100002600U >> ((ulong)(byte)data[uVar4 + 1] & 0x3f) & 1) == 0)) break;
      uVar4 = (ulong)(iVar7 + 1);
    }
    uVar3 = iVar7 + 1;
    cVar6 = data[uVar3];
    if (cVar6 != '\0') {
      iVar5 = 1;
      uVar9 = (ulong)uVar3;
      do {
        if (cVar6 == '}') {
          iVar5 = iVar5 + -1;
        }
        else if (cVar6 == '{') {
          iVar5 = iVar5 + 1;
        }
        else {
          ppuVar2 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar2 + (long)cVar6 * 2 + 1) & 0x20) == 0) {
            uVar4 = uVar9;
          }
        }
        uVar8 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar8;
        cVar6 = data[uVar9];
      } while ((cVar6 != '\0') && (iVar5 != 0));
      if (iVar5 == 0) {
        any->value_type = LYD_ANYDATA_JSON;
        if ((uint)uVar4 < uVar3) {
          return uVar8;
        }
        pcVar1 = lydict_insert(any->schema->module->ctx,data + uVar3,(ulong)((uint)uVar4 - iVar7));
        (any->value).str = pcVar1;
        return uVar8;
      }
    }
    ly_vlog(LYE_EOF,LY_VLOG_LYD,any);
    return 0;
  }
  if ((*data == '\"') && (any->schema->nodetype == LYS_ANYXML)) {
    pcVar1 = lyjson_parse_text(data + 1,&local_34);
    uVar3 = local_34;
    if (pcVar1 == (char *)0x0) {
      return 0;
    }
    if (data[local_34 + 1] == '\"') {
      pcVar1 = lydict_insert_zc(any->schema->module->ctx,pcVar1);
      (any->value).str = pcVar1;
      any->value_type = LYD_ANYDATA_CONSTSTRING;
      return uVar3 + 2;
    }
    free(pcVar1);
    pcVar1 = "JSON data (missing quotation-mark at the end of string)";
  }
  else {
    pcVar1 = "Unsupported Anydata/anyxml content (not an object nor string)";
  }
  ly_vlog(LYE_XML_INVAL,LY_VLOG_LYD,any,pcVar1);
  return 0;
}

Assistant:

static unsigned int
json_get_anydata(struct lyd_node_anydata *any, const char *data)
{
    unsigned int len = 0, start, stop, c = 0;
    char *str;

    /* anydata (as well as meaningful anyxml) is supposed to be encoded as object,
     * anyxml can be a string value, other JSON types are not supported since it is
     * not clear how they are supposed to be represented/converted into an internal representation */
    if (data[len] == '"' && any->schema->nodetype == LYS_ANYXML) {
        len = 1;
        str = lyjson_parse_text(&data[len], &c);
        if (!str) {
            return 0;
        }
        if (data[len + c] != '"') {
            free(str);
            LOGVAL(LYE_XML_INVAL, LY_VLOG_LYD, any,
                   "JSON data (missing quotation-mark at the end of string)");
            return 0;
        }

        any->value.str = lydict_insert_zc(any->schema->module->ctx, str);
        any->value_type = LYD_ANYDATA_CONSTSTRING;
        return len + c + 1;
    } else if (data[len] != '{') {
        LOGVAL(LYE_XML_INVAL, LY_VLOG_LYD, any, "Unsupported Anydata/anyxml content (not an object nor string)");
        return 0;
    }

    /* count opening '{' and closing '}' brackets to get the end of the object without its parsing */
    c = len = 1;
    len += skip_ws(&data[len]);
    start = len;
    stop = start - 1;
    while (data[len] && c) {
        switch (data[len]) {
        case '{':
            c++;
            break;
        case '}':
            c--;
            break;
        default:
            if (!isspace(data[len])) {
                stop = len;
            }
        }
        len++;
    }
    if (c) {
        LOGVAL(LYE_EOF, LY_VLOG_LYD, any);
        return 0;
    }
    any->value_type = LYD_ANYDATA_JSON;
    if (stop >= start) {
        any->value.str = lydict_insert(any->schema->module->ctx, &data[start], stop - start + 1);
    } /* else no data */

    return len;
}